

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O0

void __thiscall
TPZChunkVector<TPZGraphEl_*,_10>::Write
          (TPZChunkVector<TPZGraphEl_*,_10> *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EDX;
  TPZChunkVector<TPZGraphEl_*,_10> *in_RSI;
  TPZChunkVector<TPZGraphEl_*,_10> *in_RDI;
  uint64_t i;
  uint64_t nObjects;
  TPZStream *in_stack_ffffffffffffffc8;
  ulong local_28;
  ulong local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_20 = NElements(in_RDI);
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[6])(in_RSI,&local_20,1);
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    operator[](in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    WriteInternal<TPZGraphEl_*,_nullptr>((TPZGraphEl **)in_RDI,in_stack_ffffffffffffffc8,0);
  }
  return;
}

Assistant:

void Write(TPZStream& buf, int withclassid) const override{
        uint64_t nObjects = this->NElements();
        buf.Write(&nObjects);
        for (uint64_t i = 0; i < nObjects; i++) {
            WriteInternal(this->operator [](i), buf, withclassid);
        }
    }